

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsKBIWeakSectorTrack(Track *track,int *weak_offset,int *weak_size)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Sector *this;
  Sector *this_00;
  Data *pDVar7;
  int size;
  
  iVar3 = Track::size(track);
  if (iVar3 == 3) {
    size = 4;
  }
  else {
    if (iVar3 != 10) {
      return false;
    }
    size = 2;
  }
  this = Track::operator[](track,iVar3 + -1);
  if (this->encoding != MFM) {
    return false;
  }
  if (this->datarate != _250K) {
    return false;
  }
  if ((this->header).size != 1) {
    return false;
  }
  iVar4 = Sector::data_size(this);
  if ((0xff < iVar4) && (bVar2 = Sector::has_baddatacrc(this), bVar2)) {
    if (1 < iVar3) {
      iVar4 = 0;
      do {
        this_00 = Track::operator[](track,iVar4);
        if (this_00->encoding != MFM) {
          return false;
        }
        if (this_00->datarate != _250K) {
          return false;
        }
        if ((this_00->header).size != size) {
          return false;
        }
        iVar5 = Sector::data_size(this_00);
        iVar6 = Sector::SizeCodeToLength(size);
        if (iVar5 < iVar6) {
          return false;
        }
        iVar4 = iVar4 + 1;
      } while (iVar3 + -1 != iVar4);
    }
    pDVar7 = Sector::data_copy(this,0);
    puVar1 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*puVar1 != 'K') {
      return false;
    }
    iVar3 = isalpha((uint)puVar1[1]);
    if ((iVar3 != 0) && (iVar3 = isalpha((uint)puVar1[2]), iVar3 != 0)) {
      *weak_offset = 4;
      *weak_size = 4;
      if (opt.debug != 0) {
        util::operator<<((LogHelper *)&util::cout,(char (*) [32])"detected KBI weak sector track\n")
        ;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool IsKBIWeakSectorTrack(const Track& track, int& weak_offset, int& weak_size)
{
    auto sectors = track.size();

    // Most titles use the 10-sector version, but some have 3x2K sectors.
    int size_code;
    if (sectors == 3)
        size_code = 4;
    else if (sectors == 10)
        size_code = 2;
    else
        return false;

    // Weak sector is always last on track and 256 bytes
    auto& sectorW = track[sectors - 1];
    if (sectorW.encoding != Encoding::MFM ||
        sectorW.datarate != DataRate::_250K ||
        sectorW.header.size != 1 ||
        sectorW.data_size() < 256 ||
        !sectorW.has_baddatacrc())
    {
        return false;
    }

    // The remaining sector must be the correct type and size code.
    for (int i = 0; i < sectors - 1; ++i)
    {
        auto& sector = track[i];
        if (sector.encoding != Encoding::MFM ||
            sector.datarate != DataRate::_250K ||
            sector.header.size != size_code ||
            sector.data_size() < Sector::SizeCodeToLength(size_code))
        {
            return false;
        }
    }

    auto& dataW = sectorW.data_copy();

    // The first character of the weak sector is 'K', and the next two are alphabetic.
    if (dataW[0] != 'K' ||
        !std::isalpha(static_cast<uint8_t>(dataW[1])) ||
        !std::isalpha(static_cast<uint8_t>(dataW[2])))
    {
        return false;
    }

    // =4 -4 =124 -4 =120
    weak_offset = 4;
    weak_size = 4;

    if (opt.debug) util::cout << "detected KBI weak sector track\n";
    return true;
}